

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O1

double __thiscall
NoMeEdgeCalculator::scoreSequences
          (NoMeEdgeCalculator *this,string *code1,string *qual1,string *code2,string *qual2,
          int start1,int end1,int start2,int end2,bool isStrand1,bool isClique,int numGCAllowedPos,
          int ct)

{
  char cVar1;
  undefined8 uVar2;
  uint uVar3;
  uint __val;
  int iVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  hmm *phVar8;
  uint uVar9;
  ulong uVar10;
  _Hash_node_base *p_Var11;
  int iVar12;
  uint uVar13;
  char *__end;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *__ht;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  string *psVar17;
  double dVar18;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateMap;
  int rightNonOverlapGCCount;
  string prevCountQual;
  string compareString1;
  string compareString2;
  string compareQual1;
  string compareQual2;
  undefined1 local_210 [32];
  string *local_1f0;
  string *local_1e8;
  uint local_1dc;
  undefined1 local_1d8 [24];
  size_type sStack_1c0;
  float local_1b8;
  undefined4 uStack_1b4;
  size_type sStack_1b0;
  undefined1 auStack_1a8 [16];
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_double>,_false>_>_>
  local_198;
  __node_base_ptr local_190;
  _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  local_188 [16];
  string *local_178;
  string *local_170;
  string local_168;
  string local_148;
  undefined1 local_128 [32];
  string local_108;
  string local_e8;
  undefined1 local_c8 [32];
  string local_a8;
  string local_88;
  undefined1 local_68 [40];
  size_type sStack_40;
  __node_base_ptr local_38;
  
  local_1f0 = qual1;
  lVar6 = std::__cxx11::string::find((char *)code1,0x19b4e0,0);
  if ((lVar6 == -1) && (lVar6 = std::__cxx11::string::find((char *)code1,0x19b4dd,0), lVar6 == -1))
  {
    return -1.0;
  }
  iVar4 = 0;
  local_170 = code1;
  lVar6 = std::__cxx11::string::find((char *)code2,0x19b4e0,0);
  if ((lVar6 == -1) && (lVar6 = std::__cxx11::string::find((char *)code2,0x19b4dd,0), lVar6 == -1))
  {
    return -1.0;
  }
  uVar10 = (ulong)(uint)(start1 - start2);
  if (start1 - start2 == 0 || start1 < start2) {
    uVar10 = 0;
  }
  if (start1 < start2) {
    uVar10 = 0;
    iVar4 = -(start1 - start2);
  }
  if (end1 < end2) {
    if (start2 < start1) {
LAB_0015d142:
      iVar5 = -start1;
    }
    else {
      if (start2 <= start1) {
        if (start1 != start2) {
LAB_0015d17d:
          __val = 0;
          goto LAB_0015d180;
        }
        goto LAB_0015d142;
      }
LAB_0015d163:
      iVar5 = -start2;
    }
    __val = end1 + iVar5 + 1;
  }
  else if (end2 < end1) {
    if (start1 <= start2) {
      if (start1 < start2) {
        __val = end2 - start2;
        goto LAB_0015d180;
      }
      if (start1 != start2) goto LAB_0015d17d;
    }
    __val = (end2 - start1) + 1;
  }
  else {
    __val = 0;
    if (end1 == end2) {
      if (start1 < start2) goto LAB_0015d163;
      if ((start1 != start2 && start2 <= start1) || (start1 == start2)) goto LAB_0015d142;
    }
  }
LAB_0015d180:
  if ((int)__val < 0) {
    return -1.0;
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_1e8 = code2;
  local_178 = qual2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"","");
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"","");
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  auStack_1a8._12_4_ = 0;
  iVar5 = (int)uVar10;
  if (iVar4 == iVar5) {
    std::__cxx11::string::_M_assign((string *)&local_168);
    std::__cxx11::string::_M_assign((string *)local_128);
    std::__cxx11::string::_M_assign((string *)&local_148);
    std::__cxx11::string::_M_assign((string *)&local_108);
  }
  else {
    local_1dc = __val;
    if (iVar5 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_148);
      std::__cxx11::string::_M_assign((string *)&local_108);
      local_1d8._0_8_ = local_1d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"0","");
      local_198._M_h = (__hashtable_alloc *)local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"0","");
      if (local_170->_M_string_length != 0) {
        uVar10 = 0;
        local_1e8 = (string *)((ulong)local_1e8 & 0xffffffff00000000);
        psVar17 = local_170;
        do {
          if (local_1f0->_M_string_length <= uVar10) break;
          cVar1 = (psVar17->_M_dataplus)._M_p[uVar10];
          if ((cVar1 == 'O') || (cVar1 == 'C')) {
            if (((__node_base_ptr)local_1d8._8_8_ != local_190) ||
               (((__node_base_ptr)local_1d8._8_8_ != (__node_base_ptr)0x0 &&
                (iVar5 = bcmp((void *)local_1d8._0_8_,local_198._M_h,local_1d8._8_8_), iVar5 != 0)))
               ) goto LAB_0015d816;
            uVar2 = local_1d8._0_8_;
            piVar7 = __errno_location();
            iVar5 = *piVar7;
            *piVar7 = 0;
            lVar6 = strtol((char *)uVar2,(char **)local_210,10);
            psVar17 = local_170;
            __val = local_1dc;
            if (local_210._0_8_ != uVar2) {
              if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar7 != 0x22)) {
                if (*piVar7 == 0) {
                  *piVar7 = iVar5;
                }
                iVar5 = (int)local_1e8 + (int)lVar6;
                iVar12 = iVar5 - iVar4;
                if (iVar12 == 0) {
                  std::__cxx11::string::substr((ulong)local_210,(ulong)local_170);
                  std::__cxx11::string::_M_append((char *)&local_168,local_210._0_8_);
                  if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
                    operator_delete((void *)local_210._0_8_);
                  }
                  std::__cxx11::string::substr((ulong)local_210,(ulong)local_1f0);
                  std::__cxx11::string::_M_append(local_128,local_210._0_8_);
                }
                else {
                  if (iVar12 == 0 || iVar5 < iVar4) {
                    local_1e8._0_4_ = iVar5;
                    std::__cxx11::string::_M_replace
                              ((ulong)local_1d8,0,(char *)local_1d8._8_8_,0x199db0);
                    std::__cxx11::string::_M_replace((ulong)&local_198,0,(char *)local_190,0x199db0)
                    ;
                    local_1e8 = (string *)CONCAT44(local_1e8._4_4_,(int)local_1e8 + 2);
                    goto LAB_0015d804;
                  }
                  std::__cxx11::to_string((string *)local_210,iVar12);
                  std::__cxx11::string::_M_append((char *)&local_168,local_210._0_8_);
                  if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
                    operator_delete((void *)local_210._0_8_);
                  }
                  std::__cxx11::to_string((string *)local_210,iVar12);
                  std::__cxx11::string::_M_append(local_128,local_210._0_8_);
                  if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
                    operator_delete((void *)local_210._0_8_);
                  }
                  std::__cxx11::string::substr((ulong)local_210,(ulong)psVar17);
                  std::__cxx11::string::_M_append((char *)&local_168,local_210._0_8_);
                  if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
                    operator_delete((void *)local_210._0_8_);
                  }
                  std::__cxx11::string::substr((ulong)local_210,(ulong)local_1f0);
                  std::__cxx11::string::_M_append(local_128,local_210._0_8_);
                }
                goto LAB_0015db16;
              }
              std::__throw_out_of_range("stoi");
            }
            std::__throw_invalid_argument("stoi");
            goto LAB_0015e250;
          }
          local_210._0_8_ = local_210 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_210,local_1d8._0_8_,
                     (char *)((long)&(((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                        *)local_1d8._0_8_)->_M_h)._M_buckets +
                             (long)(_Hash_node_base **)local_1d8._8_8_));
          std::__cxx11::string::_M_replace_aux((ulong)local_210,local_210._8_8_,0,'\x01');
          std::__cxx11::string::operator=((string *)local_1d8,(string *)local_210);
          if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_);
          }
          if (psVar17->_M_string_length <= uVar10) goto LAB_0015e268;
          local_210._0_8_ = local_210 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_210,local_198._M_h,
                     (_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(local_198._M_h + (long)&local_190->_M_nxt));
          std::__cxx11::string::_M_replace_aux((ulong)local_210,local_210._8_8_,0,'\x01');
          std::__cxx11::string::operator=((string *)&local_198,(string *)local_210);
          __val = local_1dc;
          if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_);
            __val = local_1dc;
          }
LAB_0015d804:
          uVar10 = uVar10 + 1;
        } while (uVar10 < psVar17->_M_string_length);
      }
    }
    else {
      if (iVar4 != 0) goto LAB_0015db60;
      std::__cxx11::string::_M_assign((string *)&local_168);
      std::__cxx11::string::_M_assign((string *)local_128);
      local_1d8._0_8_ = local_1d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"0","");
      local_198._M_h = (__hashtable_alloc *)local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"0","");
      if (local_1e8->_M_string_length != 0) {
        uVar15 = 0;
        local_1f0 = (string *)((ulong)local_1f0 & 0xffffffff00000000);
        psVar17 = local_178;
LAB_0015d32e:
        if (psVar17->_M_string_length <= uVar15) goto LAB_0015db2a;
        cVar1 = (local_1e8->_M_dataplus)._M_p[uVar15];
        if ((cVar1 != 'O') && (cVar1 != 'C')) {
          local_210._0_8_ = local_210 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_210,local_1d8._0_8_,
                     (char *)((long)&(((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                        *)local_1d8._0_8_)->_M_h)._M_buckets +
                             (long)(_Hash_node_base **)local_1d8._8_8_));
          std::__cxx11::string::_M_replace_aux((ulong)local_210,local_210._8_8_,0,'\x01');
          std::__cxx11::string::operator=((string *)local_1d8,(string *)local_210);
          if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
            operator_delete((void *)local_210._0_8_);
          }
          if (local_1e8->_M_string_length <= uVar15) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar15)
            ;
          }
          local_210._0_8_ = local_210 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_210,local_198._M_h,
                     (_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(local_198._M_h + (long)&local_190->_M_nxt));
          std::__cxx11::string::_M_replace_aux((ulong)local_210,local_210._8_8_,0,'\x01');
          std::__cxx11::string::operator=((string *)&local_198,(string *)local_210);
          psVar17 = local_178;
          if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_);
            psVar17 = local_178;
          }
LAB_0015d54c:
          uVar15 = uVar15 + 1;
          if (local_1e8->_M_string_length <= uVar15) goto LAB_0015db2a;
          goto LAB_0015d32e;
        }
        if (((__node_base_ptr)local_1d8._8_8_ != local_190) ||
           (((__node_base_ptr)local_1d8._8_8_ != (__node_base_ptr)0x0 &&
            (iVar4 = bcmp((void *)local_1d8._0_8_,local_198._M_h,local_1d8._8_8_), iVar4 != 0))))
        goto LAB_0015d816;
        uVar2 = local_1d8._0_8_;
        piVar7 = __errno_location();
        iVar4 = *piVar7;
        *piVar7 = 0;
        lVar6 = strtol((char *)uVar2,(char **)local_210,10);
        psVar17 = local_178;
        __val = local_1dc;
        if (local_210._0_8_ == uVar2) goto LAB_0015e25c;
        if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_0015e250;
        if (*piVar7 == 0) {
          *piVar7 = iVar4;
        }
        iVar4 = (int)local_1f0 + (int)lVar6;
        iVar12 = iVar4 - iVar5;
        if (iVar12 == 0) {
          std::__cxx11::string::substr((ulong)local_210,(ulong)local_1e8);
          __val = local_1dc;
          std::__cxx11::string::_M_append((char *)&local_148,local_210._0_8_);
          if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_);
          }
          std::__cxx11::string::substr((ulong)local_210,(ulong)psVar17);
          std::__cxx11::string::_M_append((char *)&local_108,local_210._0_8_);
          goto LAB_0015db16;
        }
        if (iVar12 == 0 || iVar4 < iVar5) {
          local_1f0._0_4_ = iVar4;
          std::__cxx11::string::_M_replace((ulong)local_1d8,0,(char *)local_1d8._8_8_,0x199db0);
          std::__cxx11::string::_M_replace((ulong)&local_198,0,(char *)local_190,0x199db0);
          local_1f0 = (string *)CONCAT44(local_1f0._4_4_,(int)local_1f0 + 2);
          goto LAB_0015d54c;
        }
        std::__cxx11::to_string((string *)local_210,iVar12);
        std::__cxx11::string::_M_append((char *)&local_148,local_210._0_8_);
        if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_);
        }
        std::__cxx11::to_string((string *)local_210,iVar12);
        std::__cxx11::string::_M_append((char *)&local_108,local_210._0_8_);
        if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_);
        }
        std::__cxx11::string::substr((ulong)local_210,(ulong)local_1e8);
        std::__cxx11::string::_M_append((char *)&local_148,local_210._0_8_);
        if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_);
        }
        std::__cxx11::string::substr((ulong)local_210,(ulong)psVar17);
        std::__cxx11::string::_M_append((char *)&local_108,local_210._0_8_);
LAB_0015db16:
        if ((hmm *)local_210._0_8_ != (hmm *)(local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_);
        }
      }
    }
LAB_0015db2a:
    if (local_198._M_h != (__hashtable_alloc *)local_188) {
      operator_delete(local_198._M_h);
    }
    if ((hmm *)local_1d8._0_8_ != (hmm *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
  }
LAB_0015db60:
  if ((_Hash_node_base *)local_168._M_string_length == (_Hash_node_base *)0x0) {
    uVar13 = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar3 = 4;
      do {
        uVar13 = uVar3;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0015dc26;
        }
        if (uVar9 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0015dc26;
        }
        if (uVar9 < 10000) goto LAB_0015dc26;
        uVar10 = uVar10 / 10000;
        uVar3 = uVar13 + 4;
      } while (99999 < uVar9);
      uVar13 = uVar13 + 1;
    }
LAB_0015dc26:
    phVar8 = (hmm *)(local_1d8 + 0x10);
    local_1d8._0_8_ = phVar8;
    std::__cxx11::string::_M_construct((ulong)local_1d8,(char)uVar13);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8._0_8_,uVar13,__val);
    std::__cxx11::string::_M_append((char *)&local_168,local_1d8._0_8_);
    if ((hmm *)local_1d8._0_8_ != phVar8) {
      operator_delete((void *)local_1d8._0_8_);
    }
    uVar13 = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar3 = 4;
      do {
        uVar13 = uVar3;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0015dcc5;
        }
        if (uVar9 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0015dcc5;
        }
        if (uVar9 < 10000) goto LAB_0015dcc5;
        uVar10 = uVar10 / 10000;
        uVar3 = uVar13 + 4;
      } while (99999 < uVar9);
      uVar13 = uVar13 + 1;
    }
LAB_0015dcc5:
    local_1d8._0_8_ = phVar8;
    std::__cxx11::string::_M_construct((ulong)local_1d8,(char)uVar13);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8._0_8_,uVar13,__val);
    std::__cxx11::string::_M_append(local_128,local_1d8._0_8_);
LAB_0015dde4:
    if ((hmm *)local_1d8._0_8_ != (hmm *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
  }
  else if ((_Hash_node_base *)local_148._M_string_length == (_Hash_node_base *)0x0) {
    uVar13 = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar3 = 4;
      do {
        uVar13 = uVar3;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0015dd0b;
        }
        if (uVar9 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0015dd0b;
        }
        if (uVar9 < 10000) goto LAB_0015dd0b;
        uVar10 = uVar10 / 10000;
        uVar3 = uVar13 + 4;
      } while (99999 < uVar9);
      uVar13 = uVar13 + 1;
    }
LAB_0015dd0b:
    phVar8 = (hmm *)(local_1d8 + 0x10);
    local_1d8._0_8_ = phVar8;
    std::__cxx11::string::_M_construct((ulong)local_1d8,(char)uVar13);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8._0_8_,uVar13,__val);
    std::__cxx11::string::_M_append((char *)&local_148,local_1d8._0_8_);
    if ((hmm *)local_1d8._0_8_ != phVar8) {
      operator_delete((void *)local_1d8._0_8_);
    }
    uVar13 = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar3 = 4;
      do {
        uVar13 = uVar3;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0015ddaa;
        }
        if (uVar9 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0015ddaa;
        }
        if (uVar9 < 10000) goto LAB_0015ddaa;
        uVar10 = uVar10 / 10000;
        uVar3 = uVar13 + 4;
      } while (99999 < uVar9);
      uVar13 = uVar13 + 1;
    }
LAB_0015ddaa:
    local_1d8._0_8_ = phVar8;
    std::__cxx11::string::_M_construct((ulong)local_1d8,(char)uVar13);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8._0_8_,uVar13,__val);
    std::__cxx11::string::_M_append((char *)&local_108,local_1d8._0_8_);
    goto LAB_0015dde4;
  }
  bVar16 = local_148._M_string_length <= local_168._M_string_length;
  if (bVar16) {
    trimCodes(&local_168,(string *)local_128,__val,(int *)(auStack_1a8 + 0xc),
              local_148._M_string_length < local_168._M_string_length);
  }
  else {
    trimCodes(&local_168,(string *)local_128,__val,(int *)(auStack_1a8 + 0xc),false);
  }
  trimCodes(&local_148,&local_108,__val,(int *)(auStack_1a8 + 0xc),!bVar16);
  if ((_Hash_node_base *)local_168._M_string_length == (_Hash_node_base *)0x0) {
    iVar4 = 0;
  }
  else {
    p_Var11 = (_Hash_node_base *)0x0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (uint)(local_168._M_dataplus._M_p[(long)p_Var11] == 'O');
      p_Var11 = (_Hash_node_base *)((long)&p_Var11->_M_nxt + 1);
    } while ((_Hash_node_base *)local_168._M_string_length != p_Var11);
  }
  if ((_Hash_node_base *)local_168._M_string_length == (_Hash_node_base *)0x0) {
    iVar5 = 0;
  }
  else {
    p_Var11 = (_Hash_node_base *)0x0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (uint)(local_168._M_dataplus._M_p[(long)p_Var11] == 'C');
      p_Var11 = (_Hash_node_base *)((long)&p_Var11->_M_nxt + 1);
    } while ((_Hash_node_base *)local_168._M_string_length != p_Var11);
  }
  if ((_Hash_node_base *)local_148._M_string_length == (_Hash_node_base *)0x0) {
    iVar12 = 0;
  }
  else {
    p_Var11 = (_Hash_node_base *)0x0;
    iVar12 = 0;
    do {
      iVar12 = iVar12 + (uint)(*(char *)((long)&p_Var11->_M_nxt + (long)local_148._M_dataplus._M_p)
                              == 'O');
      p_Var11 = (_Hash_node_base *)((long)&p_Var11->_M_nxt + 1);
    } while ((_Hash_node_base *)local_148._M_string_length != p_Var11);
  }
  if ((_Hash_node_base *)local_148._M_string_length == (_Hash_node_base *)0x0) {
    iVar14 = 0;
  }
  else {
    p_Var11 = (_Hash_node_base *)0x0;
    iVar14 = 0;
    do {
      iVar14 = iVar14 + (uint)(*(char *)((long)&p_Var11->_M_nxt + (long)local_148._M_dataplus._M_p)
                              == 'C');
      p_Var11 = (_Hash_node_base *)((long)&p_Var11->_M_nxt + 1);
    } while ((_Hash_node_base *)local_148._M_string_length != p_Var11);
  }
  psVar17 = (string *)0xbff0000000000000;
  if (((local_168._M_string_length == local_148._M_string_length) &&
      (numGCAllowedPos <= iVar5 + iVar4)) && (iVar5 + iVar4 == iVar14 + iVar12)) {
    local_1d8._0_8_ = auStack_1a8;
    local_1d8._8_8_ = (__node_base_ptr)0x1;
    local_1d8._16_8_ = (_Hash_node_base *)0x0;
    sStack_1c0 = 0;
    local_1b8 = 1.0;
    sStack_1b0 = 0;
    auStack_1a8._0_8_ = (__node_base_ptr)0x0;
    if (isStrand1) {
      __ht = &(this->switchRateFS)._M_h;
    }
    else {
      __ht = &(this->switchRateRS)._M_h;
    }
    if (__ht != (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1d8) {
      std::
      _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_1d8,__ht);
    }
    phVar8 = (hmm *)operator_new(0x250);
    local_198._M_h = (__hashtable_alloc *)local_68;
    local_68._0_8_ = (__buckets_ptr)0x0;
    local_68._8_8_ = local_1d8._8_8_;
    local_68._16_8_ = (_Hash_node_base *)0x0;
    local_68._24_8_ = sStack_1c0;
    local_68._32_8_ = CONCAT44(uStack_1b4,local_1b8);
    sStack_40 = sStack_1b0;
    local_38 = (__node_base_ptr)0x0;
    std::
    _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,double>,false>>>>
              ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_198._M_h,
               (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)local_1d8,&local_198);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_168._M_dataplus._M_p,
               local_168._M_dataplus._M_p + (long)(_Hash_node_base **)local_168._M_string_length);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_128._0_8_,
               (pointer)((long)(_Hash_node_base **)local_128._0_8_ + local_128._8_8_));
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_148._M_dataplus._M_p,
               local_148._M_dataplus._M_p + (long)(_Hash_node_base **)local_148._M_string_length);
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_108._M_dataplus._M_p,
               local_108._M_string_length + local_108._M_dataplus._M_p);
    hmm::hmm(phVar8,(unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     *)local_68,&local_e8,&local_88,&local_a8,(string *)local_c8,numGCAllowedPos);
    local_210._0_8_ = phVar8;
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_68);
    dVar18 = hmm::calculateProbability((hmm *)local_210._0_8_);
    uVar2 = local_210._0_8_;
    if ((dVar18 != -1000.0) || (NAN(dVar18))) {
      local_1f0 = *(string **)
                   (&DAT_00199da0 +
                   (ulong)(this->nomeParam <= dVar18 && dVar18 != this->nomeParam) * 8);
    }
    else {
      local_1f0 = (string *)0xbff0000000000000;
    }
    if ((hmm *)local_210._0_8_ != (hmm *)0x0) {
      hmm::~hmm((hmm *)local_210._0_8_);
      operator_delete((void *)uVar2);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_1d8);
    psVar17 = local_1f0;
  }
LAB_0015e1a8:
  local_1f0 = psVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((_Hash_node_base *)local_128._0_8_ != (_Hash_node_base *)(local_128 + 0x10)) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  return (double)local_1f0;
LAB_0015d816:
  if (local_198._M_h != (__hashtable_alloc *)local_188) {
    operator_delete(local_198._M_h);
  }
  if ((hmm *)local_1d8._0_8_ != (hmm *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_);
  }
  psVar17 = (string *)0xbff0000000000000;
  goto LAB_0015e1a8;
LAB_0015e250:
  std::__throw_out_of_range("stoi");
LAB_0015e25c:
  std::__throw_invalid_argument("stoi");
LAB_0015e268:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
}

Assistant:

double NoMeEdgeCalculator::scoreSequences(std::string code1,std::string qual1, std::string code2,std::string qual2 , int start1, int end1, int start2, int end2 , bool isStrand1,bool isClique,int numGCAllowedPos, int ct) const{

    if((code1.find("C") != std::string::npos) || (code1.find("O") != std::string::npos)){
        if((code2.find("C") != std::string::npos) || (code2.find("O") != std::string::npos)){

        }else{
            return -1;
        }
    }else{
        return -1;
    }

    int overlap= 0;
    int s1=0;
    int s2=0;
    if(start1<start2){
        s2 = 0;
        s1 = start2-start1;
    }else if (start1>start2) {
        s1=0;
        s2=start1-start2;
    }else if (start1==start2) {
        s1=0;
        s2=0;
    }

    if(end1<end2){
        if(start1>start2){
            //          ----------------
           //     -------------------------------
            overlap=end1-start1+1;
        }else if (start1<start2) {
            //     --------------
            //        -----------------
            overlap=end1-start2+1;
        }else if (start1==start2) {
            //     -------------
            //     -----------------------
            overlap=end1-start1+1;
        }

    }else if (end1>end2) {
        if(start1>start2){
            //               ------------------
            //        -----------------
            overlap=end2-start1+1;
        }else if (start1<start2) {
            //     --------------------
            //        -----------
            overlap=end2-start2;
        }else if (start1==start2) {
            //        ------------------
            //        -----------
            overlap=end2-start1+1;
        }
    }else if (end1==end2) {
        if(start1<start2){
            //        ------------------
            //             -------------
            overlap=end1-start2+1;
        }else if (start1>start2) {
            //               -----------
            //        ------------------
            overlap=end1-start1+1;
        }else if (start1 == start2) {
            //        ------------------
            //        ------------------
            overlap=end1-start1+1 ;
        }
    }

    if(overlap<0){
        return -1;
    }


    string compareString1="";
    string compareQual1="";
    string compareString2="";
    string compareQual2="";
    int leftNonOverlapGCCount = -1;
    int rightNonOverlapGCCount = 0;

    if(s1==s2){
        leftNonOverlapGCCount = 0;
        compareString1 = code1;
        compareQual1 = qual1;
        compareString2 = code2;
        compareQual2 = qual2;
    }else if(s2==0){
        compareString2 = code2;
        compareQual2 = qual2;
        int distance = 0;
        int i = 0;
        string prevCountCode = "0";
        string prevCountQual = "0";
        while(i<code1.size() && i<qual1.size()){
            if(code1.at(i)=='O'||code1.at(i)=='C'){
                leftNonOverlapGCCount++;
                if(prevCountCode!=prevCountQual){
                    return -1;
                }
                distance = distance + std::stoi(prevCountCode);
                if(distance==s1){
                    compareString1 += code1.substr(i);
                    compareQual1 += qual1.substr(i);
                    break;
                }else if(distance>s1){
                   compareString1 += std::to_string(distance - s1);
                   compareQual1 += std::to_string(distance - s1);
                   compareString1 += code1.substr(i);
                   compareQual1 += qual1.substr(i);
                   break;
                }

                distance = distance + 2;
                prevCountCode = "0";
                prevCountQual = "0";
                i++;
            }else{
                prevCountCode = prevCountCode + code1.at(i);
                prevCountQual = prevCountQual + code1.at(i);
                i++;
            }
        }
    }else if(s1==0){
        compareString1 = code1;
        compareQual1 = qual1;
        int distance = 0;
        int i = 0;
        string prevCountCode = "0";
        string prevCountQual = "0";
        while(i<code2.size() && i<qual2.size()){
            if(code2.at(i)=='O'||code2.at(i)=='C'){
                leftNonOverlapGCCount++;
                if(prevCountCode!=prevCountQual){
                    return -1;
                }
                distance = distance + std::stoi(prevCountCode);
                if(distance==s2){
                    compareString2 += code2.substr(i);
                    compareQual2 += qual2.substr(i);
                    break;
                }else if(distance>s2){
                   compareString2 += std::to_string(distance - s2);
                   compareQual2 += std::to_string(distance - s2);
                   compareString2 += code2.substr(i);
                   compareQual2 += qual2.substr(i);
                   break;
                }

                distance = distance + 2;
                prevCountCode = "0";
                prevCountQual = "0";
                i++;
            }else{
                prevCountCode = prevCountCode + code2.at(i);
                prevCountQual = prevCountQual + code2.at(i);
                i++;
            }
        }
    }

    if(compareString1.size()==0){
        compareString1 += std::to_string(overlap);
        compareQual1 += std::to_string(overlap);
    }else if(compareString2.size()==0){
        compareString2 += std::to_string(overlap);
        compareQual2 += std::to_string(overlap);
    }
      if(compareString1.size()>compareString2.size()){
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,true);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,false);
    }else if(compareString1.size()<compareString2.size()){
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,false);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,true);
    }else{
        trimCodes(compareString1,compareQual1,overlap,rightNonOverlapGCCount,false);
        trimCodes(compareString2,compareQual2,overlap,rightNonOverlapGCCount,false);
    }

    int numberOfPositions1= std::count(compareString1.begin(), compareString1.end(), 'O') + std::count(compareString1.begin(), compareString1.end(), 'C');
    int numberOfPositions2= std::count(compareString2.begin(), compareString2.end(), 'O') + std::count(compareString2.begin(), compareString2.end(), 'C');
    if(numberOfPositions1!=numberOfPositions2) return -1;

    if(numberOfPositions1<numGCAllowedPos){
        return -1;
    }


    if(compareString1.size()!=compareString2.size()){
        return -1;
    }


    //Needed for checking the non overlapping sections
//    if(nonOverlap>0){
//        if(leftNonOverlapGCCount>nonOverlap || rightNonOverlapGCCount>nonOverlap){
//            return -1;
//        }
//    }

    std::unordered_map<int, double> switchRateMap;
    if(isStrand1){
        switchRateMap = this->switchRateFS;
    }else{
        switchRateMap = this->switchRateRS;
    }
    std::auto_ptr<hmm> hmmProbability(new hmm(switchRateMap,compareString1,compareQual1,compareString2,compareQual2,numGCAllowedPos));

   double score = hmmProbability->calculateProbability();
   double prob = nomeParam;

   if(score == -1000){//meaning that there is something wrong with the codes
       return -1;
   }else{
//       //For ideal Graph
//       //specificPositionErrorMap[numberOfPositions1] = std::make_pair((specificPositionErrorMap[numberOfPositions1].first+1),(specificPositionErrorMap[numberOfPositions1].second));
//       return 1;
       //For normal edge Criterion
       if(score > prob){
           return 1;
       }else{
           return -1;
       }
   }
}